

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O1

void FunctionalTester<short,_void>::Test(void)

{
  char *pcVar1;
  ushort uVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  ulong __n;
  ushort x;
  char *tmp_finish;
  undefined1 auStack_103 [3];
  undefined1 *puStack_100;
  char local_f8 [8];
  buf_t buf1;
  buf_t buf2;
  lcast_put_unsigned<std::char_traits<char>,_unsigned_short,_char> local_70;
  undefined8 local_58;
  undefined8 local_50;
  type_info_t *local_48;
  char *local_40;
  TestWatcher<short> local_31 [8];
  TestWatcher<short> tw;
  
  puStack_100 = (undefined1 *)0x106477;
  TestWatcher<short>::TestWatcher(local_31);
  x = 0x8000;
  pcVar1 = (char *)((long)&local_50 + 5);
  do {
    puStack_100 = (undefined1 *)0x10649a;
    pcVar4 = int2str::impl::converter<short,void>::run<char*>(x,local_f8);
    *pcVar4 = '\0';
    buf1._M_elems[0x38] = '\0';
    buf1._M_elems[0x39] = '\0';
    buf1._M_elems[0x3a] = '\0';
    buf1._M_elems[0x3b] = '\0';
    buf1._M_elems[0x3c] = '\0';
    buf1._M_elems[0x3d] = '\0';
    buf1._M_elems[0x3e] = '\0';
    buf1._M_elems[0x3f] = '\0';
    local_48 = (type_info_t *)((long)&local_58 + 2);
    uVar2 = -x;
    if (0 < (short)x) {
      uVar2 = x;
    }
    local_70.m_value = (type)uVar2;
    local_70.m_czero = '0';
    local_70.m_zero = 0x30;
    puStack_100 = (undefined1 *)0x1064ee;
    local_70.m_finish = pcVar1;
    local_40 = pcVar1;
    local_48 = (type_info_t *)
               boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_short,_char>::
               convert(&local_70);
    if ((short)x < 0) {
      local_48[-1] = (type_info_t)0x2d;
      local_48 = local_48 + -1;
    }
    __n = (long)pcVar1 - (long)local_48;
    if (0x3f < __n) {
      local_58 = &PTR__bad_cast_0010fd30;
      local_50 = (type_info_t *)&short::typeinfo;
      local_48 = (type_info_t *)&std::array<char,64ul>::typeinfo;
      puStack_100 = &LAB_00106617;
      local_40 = pcVar1;
      boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)&local_58);
    }
    puStack_100 = (undefined1 *)0x106521;
    local_40 = pcVar1;
    memcpy(buf1._M_elems + 0x38,local_48,__n);
    *(undefined1 *)((long)&buf1 + __n + 0x38) = 0;
    puStack_100 = (undefined1 *)0x106535;
    iVar3 = strcmp(local_f8,buf1._M_elems + 0x38);
    if (iVar3 != 0) {
      puStack_100 = (undefined1 *)0x10657e;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"FAILED\n",7);
      puStack_100 = (undefined1 *)0x10658d;
      sVar5 = strlen(local_f8);
      puStack_100 = (undefined1 *)0x10659f;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_f8,sVar5);
      puStack_100 = (undefined1 *)0x1065b7;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," != ",4);
      puStack_100 = (undefined1 *)0x1065c6;
      sVar5 = strlen(buf1._M_elems + 0x38);
      puStack_100 = (undefined1 *)0x1065d8;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,buf1._M_elems + 0x38,sVar5);
      puStack_100 = (undefined1 *)0x1065e4;
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      puStack_100 = (undefined1 *)0x1065ee;
      exit(1);
    }
    x = x + 1;
  } while (x != 0x7fff);
  puStack_100 = (undefined1 *)0x106554;
  TestWatcher<short>::~TestWatcher(local_31);
  return;
}

Assistant:

static void Test()
    {
        TestWatcher<T> const tw;
        typedef std::array<char, 64> buf_t;
        buf_t buf1;
        T const imin = std::numeric_limits<T>::min();
        T const imax = std::numeric_limits<T>::max();
        for (T i = imin; i < imax; ++i)
        {
            int2str::convert_with_zero(i, buf1.data());
#ifdef USE_BOOST
            buf_t buf2 = boost::lexical_cast<buf_t>(i);
#else
            buf_t buf2;
            sprintf(buf2.data(), PrintfFormat<T>(), i);
#endif
            StrcmpAndExit(buf1.data(), buf2.data());
        }
    }